

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::blockCurrentSol(Engine *this)

{
  uint uVar1;
  Clause *pCVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  Clause *c;
  Clause *local_38;
  
  uVar1 = (this->outputs).sz;
  local_38 = (Clause *)malloc((long)(int)uVar1 * 4 + 8);
  *(uint *)local_38 = uVar1 << 8 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  pCVar2 = local_38;
  if ((this->outputs).sz == 0) {
LAB_001b6995:
    SAT::btToLevel(&sat,0);
    sat.confl = pCVar2;
    return;
  }
  bVar4 = true;
  uVar6 = 0;
LAB_001b68e1:
  do {
    uVar5 = uVar6 + 1;
    iVar3 = (*(this->outputs).data[uVar6]->_vptr_Branching[3])();
    if (iVar3 == 0) {
      if (*(uint *)pCVar2 >> 8 <= uVar6) goto LAB_001b69b9;
      uVar1 = *(uint *)&(this->outputs).data[uVar6][1]._vptr_Branching;
      iVar3 = (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2;
    }
    else {
      iVar3 = (*(this->outputs).data[uVar6]->_vptr_Branching[10])();
      if (*(uint *)pCVar2 >> 8 <= uVar6) {
LAB_001b69b9:
        abort();
      }
    }
    pCVar2->data[uVar6].x = iVar3;
    uVar6 = uVar5;
    if ((engine.trail_lim.sz == 0) ||
       (sat.trailpos.data[(uint)(iVar3 >> 1)] < *engine.trail_lim.data)) {
      if ((this->outputs).sz <= uVar5) {
        if (!bVar4) {
          sat.confl = pCVar2;
          return;
        }
        goto LAB_001b6995;
      }
      goto LAB_001b68e1;
    }
    bVar4 = false;
    if ((this->outputs).sz <= uVar5) {
      sat.confl = pCVar2;
      return;
    }
  } while( true );
}

Assistant:

void Engine::blockCurrentSol() {
	Clause& c = *Reason_new(outputs.size());
	bool root_failure = true;
	for (unsigned int i = 0; i < outputs.size(); i++) {
		Var* v = (Var*)outputs[i];
		if (v->getType() == BOOL_VAR) {
			c[i] = ((BoolView*)outputs[i])->getValLit();
		} else {
			c[i] = ((IntVar*)outputs[i])->getValLit();
		}
		if (!sat.isRootLevel(var(c[i]))) {
			root_failure = false;
		}
		assert(sat.value(c[i]) == l_False);
	}
	if (root_failure) {
		sat.btToLevel(0);
	}
	sat.confl = &c;
}